

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O3

opStatus __thiscall
llvm::detail::DoubleAPFloat::addWithSpecial
          (DoubleAPFloat *this,DoubleAPFloat *LHS,DoubleAPFloat *RHS,DoubleAPFloat *Out,
          roundingMode RM)

{
  Storage *pSVar1;
  Storage *this_00;
  Storage *this_01;
  byte bVar2;
  APFloat *pAVar3;
  APFloat *pAVar4;
  APFloat *pAVar5;
  opStatus oVar6;
  Storage *pSVar7;
  byte bVar8;
  DoubleAPFloat *RHS_00;
  byte bVar9;
  APFloat A;
  APFloat CC;
  APFloat C;
  APFloat AA;
  undefined1 local_b0 [8];
  Storage local_a8;
  APFloat local_90;
  APFloat local_70;
  APFloat local_50;
  
  pAVar3 = (LHS->Floats)._M_t.
           super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
           super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
           super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl;
  pSVar1 = &pAVar3->U;
  pSVar7 = (Storage *)((pAVar3->U).IEEE.significand.part + 8);
  if ((pAVar3->U).semantics != (fltSemantics *)semPPCDoubleDouble) {
    pSVar7 = pSVar1;
  }
  bVar8 = *(undefined1 *)((long)pSVar7 + 0x12) & 7;
  RHS_00 = LHS;
  if (bVar8 != 1) {
    pAVar4 = (RHS->Floats)._M_t.
             super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
             super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
             super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl;
    pAVar5 = (APFloat *)(pAVar4->U).IEEE.significand.part;
    if ((pAVar4->U).semantics != (fltSemantics *)semPPCDoubleDouble) {
      pAVar5 = pAVar4;
    }
    bVar2 = *(undefined1 *)((long)&pAVar5->U + 0x12);
    bVar9 = bVar2 & 7;
    RHS_00 = RHS;
    if (((bVar9 != 1) && (bVar8 != 3)) && (RHS_00 = LHS, bVar9 != 3)) {
      if (bVar8 == 0) {
        if ((bVar9 == 0) && ((*(undefined1 *)((long)pSVar7 + 0x12) & 8) >> 3 != (bVar2 & 8) >> 3)) {
          pAVar3 = (Out->Floats)._M_t.
                   super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
                   super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
                   super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl;
          pAVar4 = (APFloat *)(pAVar3->U).IEEE.significand.part;
          if ((pAVar3->U).semantics != (fltSemantics *)semPPCDoubleDouble) {
            pAVar4 = pAVar3;
          }
          makeNaN(Out,false,(bool)((*(undefined1 *)((long)&pAVar4->U + 0x12) & 8) >> 3),(APInt *)0x0
                 );
          return opInvalidOp;
        }
      }
      else {
        RHS_00 = RHS;
        if (bVar9 != 0) {
          if ((bVar8 != 2) || (bVar9 != 2)) {
            __assert_fail("LHS.getCategory() == fcNormal && RHS.getCategory() == fcNormal",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                          ,0xfb9,
                          "APFloat::opStatus llvm::detail::DoubleAPFloat::addWithSpecial(const DoubleAPFloat &, const DoubleAPFloat &, DoubleAPFloat &, roundingMode)"
                         );
          }
          if ((pAVar3->U).semantics == (fltSemantics *)semPPCDoubleDouble) {
            DoubleAPFloat((DoubleAPFloat *)(local_b0 + 8),(DoubleAPFloat *)&pSVar1->IEEE);
          }
          else {
            IEEEFloat::IEEEFloat((IEEEFloat *)(local_b0 + 8),&pSVar1->IEEE);
          }
          pAVar3 = (LHS->Floats)._M_t.
                   super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
                   super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
                   super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl;
          pSVar7 = &local_50.U;
          pSVar1 = &pAVar3[1].U;
          if (pAVar3[1].U.semantics == (fltSemantics *)semPPCDoubleDouble) {
            DoubleAPFloat((DoubleAPFloat *)&pSVar7->IEEE,(DoubleAPFloat *)&pSVar1->IEEE);
          }
          else {
            IEEEFloat::IEEEFloat(&pSVar7->IEEE,&pSVar1->IEEE);
          }
          pAVar3 = (RHS->Floats)._M_t.
                   super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
                   super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
                   super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl;
          this_00 = &local_70.U;
          pSVar1 = &pAVar3->U;
          if ((pAVar3->U).semantics == (fltSemantics *)semPPCDoubleDouble) {
            DoubleAPFloat((DoubleAPFloat *)&this_00->IEEE,(DoubleAPFloat *)&pSVar1->IEEE);
          }
          else {
            IEEEFloat::IEEEFloat(&this_00->IEEE,&pSVar1->IEEE);
          }
          pAVar3 = (RHS->Floats)._M_t.
                   super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
                   super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
                   super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl;
          this_01 = &local_90.U;
          pSVar1 = &pAVar3[1].U;
          if (pAVar3[1].U.semantics == (fltSemantics *)semPPCDoubleDouble) {
            DoubleAPFloat((DoubleAPFloat *)&this_01->IEEE,(DoubleAPFloat *)&pSVar1->IEEE);
          }
          else {
            IEEEFloat::IEEEFloat(&this_01->IEEE,&pSVar1->IEEE);
          }
          if (local_a8.semantics != (fltSemantics *)semIEEEdouble) {
            __assert_fail("&A.getSemantics() == &semIEEEdouble",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                          ,0xfbd,
                          "APFloat::opStatus llvm::detail::DoubleAPFloat::addWithSpecial(const DoubleAPFloat &, const DoubleAPFloat &, DoubleAPFloat &, roundingMode)"
                         );
          }
          if (local_50.U.semantics != (fltSemantics *)semIEEEdouble) {
            __assert_fail("&AA.getSemantics() == &semIEEEdouble",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                          ,0xfbe,
                          "APFloat::opStatus llvm::detail::DoubleAPFloat::addWithSpecial(const DoubleAPFloat &, const DoubleAPFloat &, DoubleAPFloat &, roundingMode)"
                         );
          }
          if (local_70.U.semantics != (fltSemantics *)semIEEEdouble) {
            __assert_fail("&C.getSemantics() == &semIEEEdouble",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                          ,0xfbf,
                          "APFloat::opStatus llvm::detail::DoubleAPFloat::addWithSpecial(const DoubleAPFloat &, const DoubleAPFloat &, DoubleAPFloat &, roundingMode)"
                         );
          }
          if (local_90.U.semantics != (fltSemantics *)semIEEEdouble) {
            __assert_fail("&CC.getSemantics() == &semIEEEdouble",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                          ,0xfc0,
                          "APFloat::opStatus llvm::detail::DoubleAPFloat::addWithSpecial(const DoubleAPFloat &, const DoubleAPFloat &, DoubleAPFloat &, roundingMode)"
                         );
          }
          pAVar3 = (Out->Floats)._M_t.
                   super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
                   super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
                   super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl;
          if ((pAVar3->U).semantics == (fltSemantics *)semIEEEdouble) {
            if (pAVar3[1].U.semantics == (fltSemantics *)semIEEEdouble) {
              oVar6 = addImpl(Out,(APFloat *)local_b0,&local_50,&local_70,&local_90,RM);
              APFloat::Storage::~Storage((Storage *)&this_01->IEEE);
              APFloat::Storage::~Storage((Storage *)&this_00->IEEE);
              APFloat::Storage::~Storage((Storage *)&pSVar7->IEEE);
              APFloat::Storage::~Storage((Storage *)(local_b0 + 8));
              return oVar6;
            }
            __assert_fail("&Out.Floats[1].getSemantics() == &semIEEEdouble",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                          ,0xfc2,
                          "APFloat::opStatus llvm::detail::DoubleAPFloat::addWithSpecial(const DoubleAPFloat &, const DoubleAPFloat &, DoubleAPFloat &, roundingMode)"
                         );
          }
          __assert_fail("&Out.Floats[0].getSemantics() == &semIEEEdouble",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                        ,0xfc1,
                        "APFloat::opStatus llvm::detail::DoubleAPFloat::addWithSpecial(const DoubleAPFloat &, const DoubleAPFloat &, DoubleAPFloat &, roundingMode)"
                       );
        }
      }
    }
  }
  operator=(Out,RHS_00);
  return opOK;
}

Assistant:

APFloat::opStatus DoubleAPFloat::addWithSpecial(const DoubleAPFloat &LHS,
                                                const DoubleAPFloat &RHS,
                                                DoubleAPFloat &Out,
                                                roundingMode RM) {
  if (LHS.getCategory() == fcNaN) {
    Out = LHS;
    return opOK;
  }
  if (RHS.getCategory() == fcNaN) {
    Out = RHS;
    return opOK;
  }
  if (LHS.getCategory() == fcZero) {
    Out = RHS;
    return opOK;
  }
  if (RHS.getCategory() == fcZero) {
    Out = LHS;
    return opOK;
  }
  if (LHS.getCategory() == fcInfinity && RHS.getCategory() == fcInfinity &&
      LHS.isNegative() != RHS.isNegative()) {
    Out.makeNaN(false, Out.isNegative(), nullptr);
    return opInvalidOp;
  }
  if (LHS.getCategory() == fcInfinity) {
    Out = LHS;
    return opOK;
  }
  if (RHS.getCategory() == fcInfinity) {
    Out = RHS;
    return opOK;
  }
  assert(LHS.getCategory() == fcNormal && RHS.getCategory() == fcNormal);

  APFloat A(LHS.Floats[0]), AA(LHS.Floats[1]), C(RHS.Floats[0]),
      CC(RHS.Floats[1]);
  assert(&A.getSemantics() == &semIEEEdouble);
  assert(&AA.getSemantics() == &semIEEEdouble);
  assert(&C.getSemantics() == &semIEEEdouble);
  assert(&CC.getSemantics() == &semIEEEdouble);
  assert(&Out.Floats[0].getSemantics() == &semIEEEdouble);
  assert(&Out.Floats[1].getSemantics() == &semIEEEdouble);
  return Out.addImpl(A, AA, C, CC, RM);
}